

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CodeGeneratorResponse::MergePartialFromCodedStream
          (CodeGeneratorResponse *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  void *pvVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  Type *this_01;
  pair<int,_int> pVar8;
  int iVar9;
  UnknownFieldSet *unknown_fields;
  uint tag;
  ulong uVar10;
  int byte_limit;
  
  this_00 = &this->error_;
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001fbfc2;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001fbfc2:
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) {
LAB_001fc090:
      iVar9 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        pvVar4 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar4 & 1) == 0) {
          unknown_fields =
               internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
        }
        bVar5 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_001fc0be:
        iVar9 = 6;
        if (bVar5 != false) goto LAB_001fc0c5;
      }
    }
    else {
      uVar7 = (uint)(uVar10 >> 3) & 0x1fffffff;
      if (uVar7 == 0xf) {
        if ((char)uVar10 != 'z') goto LAB_001fc090;
        this_01 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
                            (&(this->file_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < (char)*puVar3))
        {
          input->buffer_ = puVar3 + 1;
          bVar5 = true;
        }
        else {
          byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar5 = -1 < byte_limit;
        }
        iVar9 = 6;
        if (bVar5) {
          pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
          iVar9 = 6;
          if (-1 < (long)pVar8) {
            bVar5 = CodeGeneratorResponse_File::MergePartialFromCodedStream(this_01,input);
            iVar9 = 6;
            if (bVar5) {
              bVar5 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar8.first);
              goto LAB_001fc0be;
            }
          }
        }
      }
      else {
        if ((uVar7 != 1) || ((char)uVar10 != '\n')) goto LAB_001fc090;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        if ((this->error_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar5 = internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
        iVar9 = 6;
        if (!bVar5) goto LAB_001fc0c7;
        internal::WireFormatLite::VerifyUtf8String
                  ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                   "google.protobuf.compiler.CodeGeneratorResponse.error");
LAB_001fc0c5:
        iVar9 = 0;
      }
    }
LAB_001fc0c7:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool CodeGeneratorResponse::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.compiler.CodeGeneratorResponse)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string error = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_error()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->error().data(), this->error().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorResponse.error");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_file()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.compiler.CodeGeneratorResponse)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.compiler.CodeGeneratorResponse)
  return false;
#undef DO_
}